

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

Float __thiscall pbrt::MIPMap::Bilerp<float>(MIPMap *this,int level,Point2f st)

{
  Image *this_00;
  Image *pIVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  size_t sVar4;
  float *pfVar5;
  size_t sVar6;
  array<pbrt::WrapMode,_2> wrapMode;
  WrapMode2D wrapMode_00;
  int iVar7;
  float fVar8;
  Float FVar9;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 local_38 [32];
  size_t local_18;
  size_t local_10;
  undefined1 auVar10 [64];
  
  if ((level < 0) || (uVar3 = (ulong)(uint)level, (this->pyramid).nStored <= uVar3)) {
    LogFatal<char_const(&)[37]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
               ,0x182,"Check failed: %s",(char (*) [37])"level >= 0 && level < pyramid.size()");
  }
  pIVar1 = (this->pyramid).ptr;
  this_00 = pIVar1 + uVar3;
  iVar7 = (int)pIVar1[uVar3].channelNames.nStored;
  if (iVar7 == 4) {
    wrapMode.values[1] = this->wrapMode;
    wrapMode.values[0] = this->wrapMode;
    iVar7 = 3;
  }
  else {
    if (iVar7 == 3) {
      wrapMode_00.wrap.values[1] = this->wrapMode;
      wrapMode_00.wrap.values[0] = this->wrapMode;
      Image::Bilerp((ImageChannelValues *)local_38,this_00,st,wrapMode_00);
      sVar4 = local_10;
      if (local_10 == 0) {
        fVar8 = 0.0;
      }
      else {
        pfVar5 = (float *)local_38._8_8_;
        if ((float *)local_38._8_8_ == (float *)0x0) {
          pfVar5 = (float *)(local_38 + 0x10);
        }
        fVar8 = 0.0;
        sVar6 = 0;
        do {
          fVar8 = fVar8 + pfVar5[sVar6];
          sVar6 = sVar6 + 1;
        } while (local_10 != sVar6);
      }
      local_10 = 0;
      (**(code **)(*(long *)CONCAT44(local_38._4_4_,local_38._0_4_) + 0x18))
                ((long *)CONCAT44(local_38._4_4_,local_38._0_4_),local_38._8_8_,local_18 << 2,4);
      auVar10._8_56_ = extraout_var;
      auVar10._0_8_ = extraout_XMM1_Qa;
      auVar2 = vcvtusi2ss_avx512f(auVar10._0_16_,sVar4);
      return fVar8 / auVar2._0_4_;
    }
    if (iVar7 != 1) {
      local_38._0_4_ = iVar7;
      LogFatal<int>(Fatal,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                    ,0x18c,"Unexpected number of image channels: %d",(int *)local_38);
    }
    wrapMode.values[1] = this->wrapMode;
    wrapMode.values[0] = this->wrapMode;
    iVar7 = 0;
  }
  FVar9 = Image::BilerpChannel(this_00,st,iVar7,(WrapMode2D)wrapMode.values);
  return FVar9;
}

Assistant:

Float MIPMap::Bilerp(int level, Point2f st) const {
    CHECK(level >= 0 && level < pyramid.size());
    switch (pyramid[level].NChannels()) {
    case 1:
        return pyramid[level].BilerpChannel(st, 0, wrapMode);
    case 3:
        return pyramid[level].Bilerp(st, wrapMode).Average();
    case 4:
        // Return alpha
        return pyramid[level].BilerpChannel(st, 3, wrapMode);
    default:
        LOG_FATAL("Unexpected number of image channels: %d", pyramid[level].NChannels());
    }
}